

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void addLocal(Token name)

{
  Local *pLVar1;
  Compiler *pCVar2;
  long lVar3;
  
  pCVar2 = current;
  lVar3 = (long)current->localCount;
  if (lVar3 == 0x100) {
    error("Too many local variables in function.");
    return;
  }
  current->localCount = current->localCount + 1;
  pCVar2->locals[lVar3].name.length = name.length;
  pCVar2->locals[lVar3].name.line = name.line;
  pLVar1 = pCVar2->locals + lVar3;
  (pLVar1->name).type = name.type;
  *(undefined4 *)&(pLVar1->name).field_0x4 = name._4_4_;
  (pLVar1->name).start = name.start;
  pCVar2->locals[lVar3].depth = -1;
  pCVar2->locals[lVar3].isCaptured = false;
  return;
}

Assistant:

static void addLocal(Token name) {
    if (current->localCount == UINT8_COUNT) {
        error("Too many local variables in function.");
        return;
    }
    Local *local = &current->locals[current->localCount++];
    local->name = name;
    local->depth = -1;
    local->isCaptured = false;
}